

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateCompoundVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,int expandLevel)

{
  Node *ptr;
  TestNode *node;
  SharedPtr structMember;
  
  if (0 < expandLevel) {
    ptr = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)ptr,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,ptr);
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,"struct","Structs");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
    generateVariableCases
              (context,&structMember,(TestCaseGroup *)node,queryTarget,expandLevel,expandLevel != 1)
    ;
    generateOpaqueTypeCases
              (context,&structMember,(TestCaseGroup *)node,queryTarget,expandLevel,expandLevel != 1)
    ;
    generateVariableArrayCases
              (context,&structMember,(TestCaseGroup *)node,queryTarget,expandLevel + -1);
    generateCompoundVariableCases
              (context,&structMember,(TestCaseGroup *)node,queryTarget,expandLevel + -1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&structMember);
  }
  return;
}

Assistant:

static void generateCompoundVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, int expandLevel)
{
	if (expandLevel > 0)
	{
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		tcu::TestCaseGroup* const					blockGroup		= new tcu::TestCaseGroup(context.getTestContext(), "struct", "Structs");

		targetGroup->addChild(blockGroup);

		// Struct containing basic variable
		generateVariableCases(context, structMember, blockGroup, queryTarget, expandLevel, expandLevel != 1);

		// Struct containing opaque types
		generateOpaqueTypeCases(context, structMember, blockGroup, queryTarget, expandLevel, expandLevel != 1);

		// Struct containing arrays
		generateVariableArrayCases(context, structMember, blockGroup, queryTarget, expandLevel-1);

		// Struct containing struct
		generateCompoundVariableCases(context, structMember, blockGroup, queryTarget, expandLevel-1);
	}
}